

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSeparateArgumentsCommand.cxx
# Opt level: O2

bool cmSeparateArgumentsCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  string *name;
  string *psVar1;
  char *command;
  uint5 uVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  int iVar5;
  cmValue cVar6;
  ulong uVar7;
  size_type sVar8;
  pointer pbVar9;
  string_view str;
  static_string_view name_00;
  static_string_view name_01;
  static_string_view name_02;
  static_string_view name_03;
  static_string_view name_04;
  string_view value_00;
  string_view value_01;
  string_view separator;
  string_view value_02;
  string program;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string value;
  _Any_data local_c8;
  _Manager_type local_b8;
  pointer ppStack_b0;
  pointer local_a8;
  pointer ppStack_a0;
  string *local_98;
  pointer local_90;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  unparsedArguments;
  string programArgs;
  string local_50;
  
  name = (args->
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start;
  psVar1 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  if (name == psVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,"must be given at least one argument.",(allocator<char> *)&values);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    std::__cxx11::string::~string((string *)&value);
    return false;
  }
  if ((long)psVar1 - (long)name == 0x20) {
    cVar6 = cmMakefile::GetDefinition(status->Makefile,name);
    if (cVar6.Value == (string *)0x0) {
      return true;
    }
    std::__cxx11::string::string((string *)&value,(string *)cVar6.Value);
    values.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(values.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,0x20);
    program._M_dataplus._M_p._0_1_ = 0x3b;
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )value._M_dataplus._M_p,
               (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )(value._M_dataplus._M_p + value._M_string_length),(char *)&values,(char *)&program)
    ;
    value_00._M_str = value._M_dataplus._M_p;
    value_00._M_len = value._M_string_length;
    cmMakefile::AddDefinition(status->Makefile,name,value_00);
    std::__cxx11::string::~string((string *)&value);
    return true;
  }
  if ((cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
       ::parser == '\0') &&
     (iVar5 = __cxa_guard_acquire(&cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                                   ::parser), iVar5 != 0)) {
    local_a8 = (pointer)0x0;
    ppStack_a0 = (pointer)0x0;
    local_b8 = (_Manager_type)0x0;
    ppStack_b0 = (pointer)0x0;
    local_c8._0_8_ = 0;
    local_c8._8_8_ = 0;
    value.field_2._M_allocated_capacity = 0;
    value.field_2._8_8_ = 0;
    value._M_dataplus._M_p = (pointer)0x0;
    value._M_string_length = 0;
    name_00.super_string_view._M_str = "UNIX_COMMAND";
    name_00.super_string_view._M_len = 0xc;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&value,name_00,0);
    name_01.super_string_view._M_str = "WINDOWS_COMMAND";
    name_01.super_string_view._M_len = 0xf;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&value,name_01,1);
    name_02.super_string_view._M_str = "NATIVE_COMMAND";
    name_02.super_string_view._M_len = 0xe;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&value,name_02,2);
    name_03.super_string_view._M_str = "PROGRAM";
    name_03.super_string_view._M_len = 7;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&value,name_03,3);
    name_04.super_string_view._M_str = "SEPARATE_ARGS";
    name_04.super_string_view._M_len = 0xd;
    cmArgumentParser<Arguments>::Bind<bool>((cmArgumentParser<Arguments> *)&value,name_04,4);
    ArgumentParser::ActionMap::ActionMap
              ((ActionMap *)&cmSeparateArgumentsCommand::parser,(ActionMap *)&value);
    ArgumentParser::ActionMap::~ActionMap((ActionMap *)&value);
    __cxa_atexit(ArgumentParser::Base::~Base,&cmSeparateArgumentsCommand::parser,&__dso_handle);
    __cxa_guard_release(&cmSeparateArgumentsCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)
                         ::parser);
  }
  value.field_2._M_allocated_capacity = (size_type)&unparsedArguments;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  unparsedArguments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  values.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 1;
  value._M_dataplus._M_p = (pointer)&cmSeparateArgumentsCommand::parser;
  value._M_string_length = 0;
  program._M_dataplus._M_p = program._M_dataplus._M_p & 0xffffff0000000000;
  local_c8._0_8_ = 0;
  local_c8._8_8_ = 0;
  local_b8 = (_Manager_type)0x0;
  ppStack_b0 = (pointer)0x0;
  local_a8 = (pointer)((ulong)local_a8 & 0xffffffffffffff00);
  value.field_2._8_8_ = &program;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((Instance *)&value,
             (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)&values,0);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  pbVar9 = unparsedArguments.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)program._M_dataplus._M_p & 1) == 0) {
    if (((uint)program._M_dataplus._M_p >> 8 & 1) != 0) goto LAB_002c8d89;
    if (((uint5)program._M_dataplus._M_p >> 0x10 & 1) != 0) goto LAB_002c8dba;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,
               "missing required option: \'UNIX_COMMAND\' or \'WINDOWS_COMMAND\' or \'NATIVE_COMMAND\'"
               ,(allocator<char> *)&values);
    std::__cxx11::string::_M_assign((string *)&status->Error);
    goto LAB_002c8ff9;
  }
  if (((uint)program._M_dataplus._M_p >> 8 & 1) == 0) {
LAB_002c8d89:
    if (((uint5)program._M_dataplus._M_p >> 0x10 & 1) != 0) goto LAB_002c8d8e;
LAB_002c8dba:
    uVar2 = (uint5)program._M_dataplus._M_p >> 0x18;
    if ((((ulong)program._M_dataplus._M_p & 0x100000000) == 0) || ((uVar2 & 1) != 0)) {
      if ((ulong)((long)unparsedArguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)unparsedArguments.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) < 0x21) {
        if (unparsedArguments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            unparsedArguments.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          bVar4 = true;
          cmMakefile::AddDefinition(status->Makefile,name,(string_view)ZEXT816(0));
          goto LAB_002c9005;
        }
        if ((unparsedArguments.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->_M_string_length == 0) {
          bVar4 = true;
          auVar3._8_8_ = 0;
          auVar3._0_8_ = ((unparsedArguments.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          cmMakefile::AddDefinition(status->Makefile,name,(string_view)(auVar3 << 0x40));
          goto LAB_002c9005;
        }
        if (((~(byte)((ulong)program._M_dataplus._M_p >> 0x18) |
             (byte)((ulong)program._M_dataplus._M_p >> 0x20)) & 1) == 0) {
          program._M_dataplus._M_p = (pointer)&program.field_2;
          program._M_string_length = 0;
          programArgs._M_dataplus._M_p = (pointer)&programArgs.field_2;
          programArgs._M_string_length = 0;
          program.field_2._M_allocated_capacity =
               program.field_2._M_allocated_capacity & 0xffffffffffffff00;
          programArgs.field_2._M_local_buf[0] = '\0';
          str._M_str = ((unparsedArguments.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          str._M_len = (unparsedArguments.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
          cmTrimWhitespace_abi_cxx11_(&value,str);
          sVar8 = value._M_string_length;
          std::__cxx11::string::~string((string *)&value);
          if (sVar8 != 0) {
            values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            cmsys::SystemTools::FindProgram(&value,pbVar9,&values,false);
            std::__cxx11::string::operator=((string *)&program,(string *)&value);
            std::__cxx11::string::~string((string *)&value);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(&values);
          }
          if (program._M_string_length == 0) {
            bVar4 = cmSystemTools::SplitProgramFromArgs(pbVar9,&program,&programArgs);
            if ((bVar4) && (bVar4 = cmsys::SystemTools::FileExists(&program), !bVar4)) {
              values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              values.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              cmsys::SystemTools::FindProgram(&value,&program,&values,false);
              std::__cxx11::string::operator=((string *)&program,(string *)&value);
              std::__cxx11::string::~string((string *)&value);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector(&values);
            }
            if (program._M_string_length != 0) goto LAB_002c8f45;
            sVar8 = 0;
          }
          else {
LAB_002c8f45:
            value._M_string_length = (size_type)&value.field_2;
            value._M_dataplus._M_p = (pointer)0x1;
            value.field_2._M_local_buf[0] = 0x3b;
            values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)programArgs._M_string_length;
            values.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)programArgs._M_dataplus._M_p;
            cmStrCat<>(&local_50,(cmAlphaNum *)&value,(cmAlphaNum *)&values);
            std::__cxx11::string::append((string *)&program);
            std::__cxx11::string::~string((string *)&local_50);
            sVar8 = program._M_string_length;
          }
          value_01._M_str = program._M_dataplus._M_p;
          value_01._M_len = sVar8;
          cmMakefile::AddDefinition(status->Makefile,name,value_01);
          std::__cxx11::string::~string((string *)&programArgs);
          std::__cxx11::string::~string((string *)&program);
        }
        else {
          values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          values.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          command = ((unparsedArguments.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
          if (((ulong)program._M_dataplus._M_p & 0x10001) == 0) {
            cmSystemTools::ParseWindowsCommandLine(command,&values);
          }
          else {
            cmSystemTools::ParseUnixCommandLine(command,&values);
          }
          if (((uVar2 & 1) != 0) &&
             (bVar4 = cmsys::SystemTools::FileExists
                                (values.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start), !bVar4)) {
            program._M_dataplus._M_p = (pointer)0x0;
            program._M_string_length = 0;
            program.field_2._M_allocated_capacity = 0;
            cmsys::SystemTools::FindProgram
                      (&value,values.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&program,false);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&program);
            if (value._M_string_length == 0) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::clear(&values);
            }
            else {
              std::__cxx11::string::_M_assign
                        ((string *)
                         values.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start);
            }
            std::__cxx11::string::~string((string *)&value);
          }
          local_90 = values.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          local_98 = name;
          for (pbVar9 = values.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start; pbVar9 != local_90;
              pbVar9 = pbVar9 + 1) {
            while (uVar7 = std::__cxx11::string::find((char)pbVar9,0x3b),
                  uVar7 != 0xffffffffffffffff) {
              std::__cxx11::string::insert((ulong)pbVar9,uVar7,'\x01');
            }
          }
          separator._M_str = ";";
          separator._M_len = 1;
          cmJoin(&value,&values,separator,(string_view)ZEXT816(0));
          value_02._M_str = value._M_dataplus._M_p;
          value_02._M_len = value._M_string_length;
          cmMakefile::AddDefinition(status->Makefile,local_98,value_02);
          std::__cxx11::string::~string((string *)&value);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&values);
        }
        bVar4 = true;
        goto LAB_002c9005;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"given unexpected argument(s)",(allocator<char> *)&values);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&value,"`SEPARATE_ARGS` option requires `PROGRAM\' option",
                 (allocator<char> *)&values);
      std::__cxx11::string::_M_assign((string *)&status->Error);
    }
  }
  else {
LAB_002c8d8e:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,
               "\'UNIX_COMMAND\', \'WINDOWS_COMMAND\' and \'NATIVE_COMMAND\' are mutually exclusive"
               ,(allocator<char> *)&values);
    std::__cxx11::string::_M_assign((string *)&status->Error);
  }
LAB_002c8ff9:
  std::__cxx11::string::~string((string *)&value);
  bVar4 = false;
LAB_002c9005:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&unparsedArguments);
  return bVar4;
}

Assistant:

bool cmSeparateArgumentsCommand(std::vector<std::string> const& args,
                                cmExecutionStatus& status)
{
  if (args.empty()) {
    status.SetError("must be given at least one argument.");
    return false;
  }

  std::string const& var = args.front();

  if (args.size() == 1) {
    // Original space-replacement version of command.
    if (cmValue def = status.GetMakefile().GetDefinition(var)) {
      std::string value = *def;
      std::replace(value.begin(), value.end(), ' ', ';');
      status.GetMakefile().AddDefinition(var, value);
    }

    return true;
  }

  struct Arguments
  {
    bool UnixCommand = false;
    bool WindowsCommand = false;
    bool NativeCommand = false;
    bool Program = false;
    bool SeparateArgs = false;
  };

  static auto const parser =
    cmArgumentParser<Arguments>{}
      .Bind("UNIX_COMMAND"_s, &Arguments::UnixCommand)
      .Bind("WINDOWS_COMMAND"_s, &Arguments::WindowsCommand)
      .Bind("NATIVE_COMMAND"_s, &Arguments::NativeCommand)
      .Bind("PROGRAM"_s, &Arguments::Program)
      .Bind("SEPARATE_ARGS"_s, &Arguments::SeparateArgs);

  std::vector<std::string> unparsedArguments;
  Arguments arguments =
    parser.Parse(cmMakeRange(args).advance(1), &unparsedArguments);

  if (!arguments.UnixCommand && !arguments.WindowsCommand &&
      !arguments.NativeCommand) {
    status.SetError("missing required option: 'UNIX_COMMAND' or "
                    "'WINDOWS_COMMAND' or 'NATIVE_COMMAND'");
    return false;
  }
  if ((arguments.UnixCommand && arguments.WindowsCommand) ||
      (arguments.UnixCommand && arguments.NativeCommand) ||
      (arguments.WindowsCommand && arguments.NativeCommand)) {
    status.SetError("'UNIX_COMMAND', 'WINDOWS_COMMAND' and 'NATIVE_COMMAND' "
                    "are mutually exclusive");
    return false;
  }
  if (arguments.SeparateArgs && !arguments.Program) {
    status.SetError("`SEPARATE_ARGS` option requires `PROGRAM' option");
    return false;
  }

  if (unparsedArguments.size() > 1) {
    status.SetError("given unexpected argument(s)");
    return false;
  }

  if (unparsedArguments.empty()) {
    status.GetMakefile().AddDefinition(var, cm::string_view{});
    return true;
  }

  std::string& command = unparsedArguments.front();

  if (command.empty()) {
    status.GetMakefile().AddDefinition(var, command);
    return true;
  }

  if (arguments.Program && !arguments.SeparateArgs) {
    std::string program;
    std::string programArgs;

    // First assume the path to the program was specified with no
    // arguments and with no quoting or escaping for spaces.
    // Only bother doing this if there is non-whitespace.
    if (!cmTrimWhitespace(command).empty()) {
      program = cmSystemTools::FindProgram(command);
    }

    // If that failed then assume a command-line string was given
    // and split the program part from the rest of the arguments.
    if (program.empty()) {
      if (cmSystemTools::SplitProgramFromArgs(command, program, programArgs)) {
        if (!cmSystemTools::FileExists(program)) {
          program = cmSystemTools::FindProgram(program);
        }
      }
    }

    if (!program.empty()) {
      program += cmStrCat(';', programArgs);
    }

    status.GetMakefile().AddDefinition(var, program);
    return true;
  }

  // split command given
  std::vector<std::string> values;

  if (arguments.NativeCommand) {
#if defined(_WIN32)
    arguments.WindowsCommand = true;
#else
    arguments.UnixCommand = true;
#endif
  }

  if (arguments.UnixCommand) {
    cmSystemTools::ParseUnixCommandLine(command.c_str(), values);
  } else {
    cmSystemTools::ParseWindowsCommandLine(command.c_str(), values);
  }

  if (arguments.Program) {
    // check program exist
    if (!cmSystemTools::FileExists(values.front())) {
      auto result = cmSystemTools::FindProgram(values.front());
      if (result.empty()) {
        values.clear();
      } else {
        values.front() = result;
      }
    }
  }

  // preserve semicolons in arguments
  std::for_each(values.begin(), values.end(), [](std::string& value) {
    std::string::size_type pos = 0;
    while ((pos = value.find_first_of(';', pos)) != std::string::npos) {
      value.insert(pos, 1, '\\');
      pos += 2;
    }
  });
  auto value = cmJoin(values, ";");
  status.GetMakefile().AddDefinition(var, value);

  return true;
}